

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subquery_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::SubqueryExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SubqueryExpression *this)

{
  pointer pPVar1;
  pointer pSVar2;
  InternalException *this_00;
  ExpressionType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  switch(this->subquery_type) {
  case SCALAR:
    pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar2->super_SQLStatement)._vptr_SQLStatement[2])(&local_100,pSVar2);
    ::std::operator+(&local_120,"(",&local_100);
    ::std::operator+(__return_storage_ptr__,&local_120,")");
    break;
  case EXISTS:
    pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar2->super_SQLStatement)._vptr_SQLStatement[2])(&local_100,pSVar2);
    ::std::operator+(&local_120,"EXISTS(",&local_100);
    ::std::operator+(__return_storage_ptr__,&local_120,")");
    break;
  case NOT_EXISTS:
    pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar2->super_SQLStatement)._vptr_SQLStatement[2])(&local_100,pSVar2);
    ::std::operator+(&local_120,"NOT EXISTS(",&local_100);
    ::std::operator+(__return_storage_ptr__,&local_120,")");
    break;
  case ANY:
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->child);
    (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_40,pPVar1);
    ::std::operator+(&local_a0,"(",&local_40);
    ::std::operator+(&local_80,&local_a0," ");
    ExpressionTypeToOperator_abi_cxx11_(&local_c0,(duckdb *)(ulong)this->comparison_type,type);
    ::std::operator+(&local_60,&local_80,&local_c0);
    ::std::operator+(&local_100,&local_60," ANY(");
    pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->subquery);
    (*(pSVar2->super_SQLStatement)._vptr_SQLStatement[2])(&local_e0,pSVar2);
    ::std::operator+(&local_120,&local_100,&local_e0);
    ::std::operator+(__return_storage_ptr__,&local_120,"))");
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    this_01 = &local_40;
    goto LAB_01326a0b;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_120,"Unrecognized type for subquery",(allocator *)&local_100);
    InternalException::InternalException(this_00,(string *)&local_120);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::~string((string *)&local_120);
  this_01 = &local_100;
LAB_01326a0b:
  ::std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

string SubqueryExpression::ToString() const {
	switch (subquery_type) {
	case SubqueryType::ANY:
		return "(" + child->ToString() + " " + ExpressionTypeToOperator(comparison_type) + " ANY(" +
		       subquery->ToString() + "))";
	case SubqueryType::EXISTS:
		return "EXISTS(" + subquery->ToString() + ")";
	case SubqueryType::NOT_EXISTS:
		return "NOT EXISTS(" + subquery->ToString() + ")";
	case SubqueryType::SCALAR:
		return "(" + subquery->ToString() + ")";
	default:
		throw InternalException("Unrecognized type for subquery");
	}
}